

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void deMutex_selfTest(void)

{
  deBool dVar1;
  deBool dVar2;
  deThread dVar3;
  deMutex dStack_80;
  deBool ret_2;
  deMutex mutex_3;
  deThread thread_1;
  deBool ret_1;
  int ndx_1;
  deThread threads [2];
  deMutex local_50;
  MutexData2 data;
  deThread thread;
  deMutex mutex_2;
  int numLocks;
  int ndx;
  deMutex mutex_1;
  deMutexAttributes attrs;
  deBool ret;
  deMutex mutex;
  
  _attrs = deMutex_create((deMutexAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (_attrs == 0)) {
      deAssertFail("mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0xee);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deMutex_lock(_attrs);
  deMutex_unlock(_attrs);
  mutex_1._4_4_ = deMutex_tryLock(_attrs);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (mutex_1._4_4_ == 0)) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0xf5);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deMutex_unlock(_attrs);
  deMutex_destroy(_attrs);
  mutex_2._0_4_ = 10;
  deMemset(&mutex_1,0,4);
  mutex_1._0_4_ = 1;
  _numLocks = deMutex_create((deMutexAttributes *)&mutex_1);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (_numLocks == 0)) {
      deAssertFail("mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x107);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  for (mutex_2._4_4_ = 0; mutex_2._4_4_ < (int)mutex_2; mutex_2._4_4_ = mutex_2._4_4_ + 1) {
    deMutex_lock(_numLocks);
  }
  for (mutex_2._4_4_ = 0; mutex_2._4_4_ < (int)mutex_2; mutex_2._4_4_ = mutex_2._4_4_ + 1) {
    deMutex_unlock(_numLocks);
  }
  deMutex_destroy(_numLocks);
  thread = deMutex_create((deMutexAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (thread == 0)) {
      deAssertFail("mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x118);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deMutex_lock(thread);
  data._16_8_ = deThread_create(mutexTestThr1,&thread,(deThreadAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (data._16_8_ == 0)) {
      deAssertFail("thread",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x11d);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deSleep(100);
  deMutex_unlock(thread);
  deMutex_lock(thread);
  deMutex_unlock(thread);
  deThread_join(data._16_8_);
  deThread_destroy(data._16_8_);
  deMutex_destroy(thread);
  local_50 = deMutex_create((deMutexAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (local_50 == 0)) {
      deAssertFail("data.mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x132);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  data.mutex._0_4_ = 0;
  data.mutex._4_4_ = 0;
  data.counter = 1000;
  deMutex_lock(local_50);
  for (thread_1._4_4_ = 0; thread_1._4_4_ < 2; thread_1._4_4_ = thread_1._4_4_ + 1) {
    dVar3 = deThread_create(mutexTestThr2,&local_50,(deThreadAttributes *)0x0);
    *(deThread *)(&ret_1 + (long)thread_1._4_4_ * 2) = dVar3;
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) || (*(long *)(&ret_1 + (long)thread_1._4_4_ * 2) == 0)) {
        deAssertFail("threads[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                     ,0x13d);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
  }
  deMutex_unlock(local_50);
  for (thread_1._4_4_ = 0; thread_1._4_4_ < 2; thread_1._4_4_ = thread_1._4_4_ + 1) {
    thread_1._0_4_ = deThread_join(*(deThread *)(&ret_1 + (long)thread_1._4_4_ * 2));
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) || ((deBool)thread_1 == 0)) {
        deAssertFail("ret",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                     ,0x145);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    deThread_destroy(*(deThread *)(&ret_1 + (long)thread_1._4_4_ * 2));
  }
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || ((int)data.mutex != data.mutex._4_4_)) {
      deAssertFail("data.counter == data.counter2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x149);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (data.counter != (int)data.mutex)) {
      deAssertFail("data.maxVal == data.counter",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x14a);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deMutex_destroy(local_50);
  dStack_80 = deMutex_create((deMutexAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (dStack_80 == 0)) {
      deAssertFail("mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x154);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deMutex_lock(dStack_80);
  mutex_3 = deThread_create(mutexTestThr3,&stack0xffffffffffffff80,(deThreadAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (dStack_80 == 0)) {
      deAssertFail("mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x159);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  dVar1 = deThread_join(mutex_3);
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (dVar1 == 0)) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x15c);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  deMutex_unlock(dStack_80);
  deMutex_destroy(dStack_80);
  deThread_destroy(mutex_3);
  return;
}

Assistant:

void deMutex_selfTest (void)
{
	/* Default mutex from single thread. */
	{
		deMutex mutex = deMutex_create(DE_NULL);
		deBool	ret;
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);
		deMutex_unlock(mutex);

		/* Should succeed. */
		ret = deMutex_tryLock(mutex);
		DE_TEST_ASSERT(ret);
		deMutex_unlock(mutex);

		deMutex_destroy(mutex);
	}

	/* Recursive mutex. */
	{
		deMutexAttributes	attrs;
		deMutex				mutex;
		int					ndx;
		int					numLocks	= 10;

		deMemset(&attrs, 0, sizeof(attrs));

		attrs.flags = DE_MUTEX_RECURSIVE;

		mutex = deMutex_create(&attrs);
		DE_TEST_ASSERT(mutex);

		for (ndx = 0; ndx < numLocks; ndx++)
			deMutex_lock(mutex);

		for (ndx = 0; ndx < numLocks; ndx++)
			deMutex_unlock(mutex);

		deMutex_destroy(mutex);
	}

	/* Mutex and threads. */
	{
		deMutex		mutex;
		deThread	thread;

		mutex = deMutex_create(DE_NULL);
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);

		thread = deThread_create(mutexTestThr1, &mutex, DE_NULL);
		DE_TEST_ASSERT(thread);

		deSleep(100);
		deMutex_unlock(mutex);

		deMutex_lock(mutex);
		deMutex_unlock(mutex);

		deThread_join(thread);

		deThread_destroy(thread);
		deMutex_destroy(mutex);
	}

	/* A bit more complex mutex test. */
	{
		MutexData2	data;
		deThread	threads[2];
		int			ndx;

		data.mutex	= deMutex_create(DE_NULL);
		DE_TEST_ASSERT(data.mutex);

		data.counter	= 0;
		data.counter2	= 0;
		data.maxVal		= 1000;

		deMutex_lock(data.mutex);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(threads); ndx++)
		{
			threads[ndx] = deThread_create(mutexTestThr2, &data, DE_NULL);
			DE_TEST_ASSERT(threads[ndx]);
		}

		deMutex_unlock(data.mutex);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(threads); ndx++)
		{
			deBool ret = deThread_join(threads[ndx]);
			DE_TEST_ASSERT(ret);
			deThread_destroy(threads[ndx]);
		}

		DE_TEST_ASSERT(data.counter == data.counter2);
		DE_TEST_ASSERT(data.maxVal == data.counter);

		deMutex_destroy(data.mutex);
	}

	/* tryLock() deadlock test. */
	{
		deThread	thread;
		deMutex		mutex	= deMutex_create(DE_NULL);
		deBool		ret;
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);

		thread = deThread_create(mutexTestThr3, &mutex, DE_NULL);
		DE_TEST_ASSERT(mutex);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		deMutex_unlock(mutex);
		deMutex_destroy(mutex);
		deThread_destroy(thread);
	}
}